

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,uint c)

{
  int in_ESI;
  ImGuiInputEvent *in_RDI;
  ImGuiInputEvent e;
  ImGuiContext *g;
  
  if ((in_ESI != 0) &&
     ((undefined1  [12])((undefined1  [12])in_RDI[0x251].field_2 & (undefined1  [12])0x100) !=
      (undefined1  [12])0x0)) {
    ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)0x48de82);
    ImVector<ImGuiInputEvent>::push_back((ImVector<ImGuiInputEvent> *)0x200000005,in_RDI);
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(unsigned int c)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (c == 0 || !AppAcceptingEvents)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Text;
    e.Source = ImGuiInputSource_Keyboard;
    e.Text.Char = c;
    g.InputEventsQueue.push_back(e);
}